

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  cmMakefile *pcVar1;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  static_string_view keyword_02;
  static_string_view keyword_03;
  static_string_view keyword_04;
  static_string_view keyword_05;
  static_string_view keyword_06;
  static_string_view keyword_07;
  static_string_view kw;
  size_t sVar2;
  bool bVar3;
  reference pcVar4;
  char *pcVar5;
  cmTarget *pcVar6;
  char *pcVar7;
  cmState *pcVar8;
  pointer pcVar9;
  string *psVar10;
  cmTest *pcVar11;
  static_string_view prefix;
  static_string_view prefix_00;
  cmValue local_210;
  undefined1 local_208 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cache;
  char *local_1e0;
  undefined1 local_1d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> env;
  char *local_1b0;
  bool local_1a1;
  bool result;
  size_type varNameLen;
  string *var;
  PolicyID local_14c;
  size_t sStack_148;
  PolicyID pid;
  char *local_140;
  _List_node_base *local_128;
  _List_node_base *p_Stack_120;
  Command local_118;
  size_t local_f8;
  char *local_f0;
  _List_node_base *local_e8;
  _List_node_base *local_e0;
  size_t local_d8;
  char *local_d0;
  _List_node_base *local_c8;
  _List_node_base *local_c0;
  size_t local_b8;
  char *local_b0;
  _List_node_base *local_a8;
  _List_node_base *local_a0;
  size_t local_98;
  char *local_90;
  _List_node_base *local_88;
  _List_node_base *local_80;
  size_t local_78;
  char *local_70;
  _Self local_68;
  size_t local_60;
  char *local_58;
  undefined1 local_50 [8];
  anon_class_16_2_3fddba98 policyCheck;
  undefined1 auStack_38 [8];
  CurrentAndNextIter args;
  MessageType *param_3_local;
  string *param_2_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  args.next._M_node = (_List_node_base *)param_3;
  _auStack_38 = cmArgumentList::make2ArgsIterator(newArgs);
  while( true ) {
    policyCheck.args =
         (CurrentAndNextIter *)
         std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
         end(&newArgs->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
    bVar3 = std::operator!=((_Self *)auStack_38,(_Self *)&policyCheck.args);
    if (!bVar3) break;
    policyCheck.this = (cmConditionEvaluator *)auStack_38;
    local_60 = (anonymous_namespace)::keyTEST;
    local_58 = DAT_00fc7aa0;
    kw.super_string_view._M_str = DAT_00fc7aa0;
    kw.super_string_view._M_len = (anonymous_namespace)::keyTEST;
    pcVar5 = DAT_00fc7aa0;
    local_50 = (undefined1  [8])this;
    HandleLevel1::anon_class_16_2_3fddba98::operator()
              ((anon_class_16_2_3fddba98 *)local_50,CMP0064,this->Policy64Status,kw);
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
         end(&newArgs->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
    bVar3 = std::operator==(&args.current,&local_68);
    if (!bVar3) {
      local_78 = (anonymous_namespace)::keyEXISTS;
      local_70 = DAT_00fc7940;
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                         ((_List_iterator<cmExpandedCommandArgument> *)auStack_38);
      keyword_07.super_string_view._M_str = local_70;
      keyword_07.super_string_view._M_len = local_78;
      bVar3 = IsKeyword(this,keyword_07,pcVar4);
      if (bVar3) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&args.current);
        psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
        bVar3 = cmsys::SystemTools::FileExists(psVar10);
        local_88 = (_List_node_base *)auStack_38;
        local_80 = args.current._M_node;
        cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                  (newArgs,bVar3,_auStack_38);
      }
      else {
        local_98 = (anonymous_namespace)::keyIS_DIRECTORY;
        local_90 = DAT_00fc7990;
        pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                           ((_List_iterator<cmExpandedCommandArgument> *)auStack_38);
        keyword_06.super_string_view._M_str = local_90;
        keyword_06.super_string_view._M_len = local_98;
        bVar3 = IsKeyword(this,keyword_06,pcVar4);
        if (bVar3) {
          pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&args.current);
          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
          bVar3 = cmsys::SystemTools::FileIsDirectory(psVar10);
          local_a8 = (_List_node_base *)auStack_38;
          local_a0 = args.current._M_node;
          cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                    (newArgs,bVar3,_auStack_38);
        }
        else {
          local_b8 = (anonymous_namespace)::keyIS_SYMLINK;
          local_b0 = DAT_00fc79b0;
          pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                             ((_List_iterator<cmExpandedCommandArgument> *)auStack_38);
          keyword_05.super_string_view._M_str = local_b0;
          keyword_05.super_string_view._M_len = local_b8;
          bVar3 = IsKeyword(this,keyword_05,pcVar4);
          if (bVar3) {
            pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&args.current);
            psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
            bVar3 = cmsys::SystemTools::FileIsSymlink(psVar10);
            local_c8 = (_List_node_base *)auStack_38;
            local_c0 = args.current._M_node;
            cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                      (newArgs,bVar3,_auStack_38);
          }
          else {
            local_d8 = (anonymous_namespace)::keyIS_ABSOLUTE;
            local_d0 = DAT_00fc7980;
            pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                               ((_List_iterator<cmExpandedCommandArgument> *)auStack_38);
            keyword_04.super_string_view._M_str = local_d0;
            keyword_04.super_string_view._M_len = local_d8;
            bVar3 = IsKeyword(this,keyword_04,pcVar4);
            if (bVar3) {
              pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&args.current);
              psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
              bVar3 = cmsys::SystemTools::FileIsFullPath(psVar10);
              local_e8 = (_List_node_base *)auStack_38;
              local_e0 = args.current._M_node;
              cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                        (newArgs,bVar3,_auStack_38);
            }
            else {
              local_f8 = (anonymous_namespace)::keyCOMMAND;
              local_f0 = DAT_00fc7910;
              pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                 ((_List_iterator<cmExpandedCommandArgument> *)auStack_38);
              keyword_03.super_string_view._M_str = local_f0;
              keyword_03.super_string_view._M_len = local_f8;
              bVar3 = IsKeyword(this,keyword_03,pcVar4);
              if (bVar3) {
                pcVar8 = cmMakefile::GetState(this->Makefile);
                pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&args.current);
                psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
                cmState::GetCommand(&local_118,pcVar8,psVar10);
                bVar3 = std::function::operator_cast_to_bool((function *)&local_118);
                local_128 = (_List_node_base *)auStack_38;
                p_Stack_120 = args.current._M_node;
                cmArgumentList::
                ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                          (newArgs,bVar3,_auStack_38);
                std::
                function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                ::~function(&local_118);
              }
              else {
                sStack_148 = (anonymous_namespace)::keyPOLICY;
                local_140 = DAT_00fc7a30;
                pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                   ((_List_iterator<cmExpandedCommandArgument> *)auStack_38);
                keyword_02.super_string_view._M_str = local_140;
                keyword_02.super_string_view._M_len = sStack_148;
                bVar3 = IsKeyword(this,keyword_02,pcVar4);
                pcVar7 = DAT_00fc7a90;
                sVar2 = (anonymous_namespace)::keyTARGET;
                if (bVar3) {
                  pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&args.current)
                  ;
                  cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  bVar3 = cmPolicies::GetPolicyID(pcVar5,&local_14c);
                  cmArgumentList::
                  ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                            (newArgs,bVar3,_auStack_38);
                }
                else {
                  pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                     ((_List_iterator<cmExpandedCommandArgument> *)auStack_38);
                  keyword_01.super_string_view._M_str = pcVar7;
                  keyword_01.super_string_view._M_len = sVar2;
                  bVar3 = IsKeyword(this,keyword_01,pcVar4);
                  pcVar7 = DAT_00fc7920;
                  sVar2 = (anonymous_namespace)::keyDEFINED;
                  if (bVar3) {
                    pcVar1 = this->Makefile;
                    pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                                       (&args.current);
                    psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
                    pcVar6 = cmMakefile::FindTargetToUse(pcVar1,psVar10,false);
                    cmArgumentList::
                    ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                              (newArgs,pcVar6 != (cmTarget *)0x0,_auStack_38);
                  }
                  else {
                    pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                       ((_List_iterator<cmExpandedCommandArgument> *)auStack_38);
                    keyword_00.super_string_view._M_str = pcVar7;
                    keyword_00.super_string_view._M_len = sVar2;
                    bVar3 = IsKeyword(this,keyword_00,pcVar4);
                    pcVar7 = DAT_00fc7aa0;
                    sVar2 = (anonymous_namespace)::keyTEST;
                    if (bVar3) {
                      pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                                         (&args.current);
                      psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
                      pcVar7 = (char *)std::__cxx11::string::size();
                      join_0x00000010_0x00000000_ = (string_view)::cm::operator____s("ENV",3);
                      prefix.super_string_view._M_str = pcVar7;
                      prefix.super_string_view._M_len = (size_t)local_1b0;
                      bVar3 = anon_unknown.dwarf_119b623::looksLikeSpecialVariable
                                        ((anon_unknown_dwarf_119b623 *)psVar10,
                                         (string *)env.field_2._8_8_,prefix,(size_t)pcVar5);
                      if (bVar3) {
                        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                                           (&args.current);
                        psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
                        std::__cxx11::string::substr((ulong)local_1d8,(ulong)psVar10);
                        local_1a1 = cmsys::SystemTools::HasEnv((string *)local_1d8);
                        std::__cxx11::string::~string((string *)local_1d8);
                      }
                      else {
                        join_0x00000010_0x00000000_ = (string_view)::cm::operator____s("CACHE",5);
                        prefix_00.super_string_view._M_str = pcVar7;
                        prefix_00.super_string_view._M_len = (size_t)local_1e0;
                        bVar3 = anon_unknown.dwarf_119b623::looksLikeSpecialVariable
                                          ((anon_unknown_dwarf_119b623 *)psVar10,
                                           (string *)cache.field_2._8_8_,prefix_00,(size_t)pcVar5);
                        if (bVar3) {
                          pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                                             (&args.current);
                          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
                          std::__cxx11::string::substr((ulong)local_208,(ulong)psVar10);
                          pcVar8 = cmMakefile::GetState(this->Makefile);
                          local_210 = cmState::GetCacheEntryValue(pcVar8,(string *)local_208);
                          local_1a1 = cmValue::operator_cast_to_bool(&local_210);
                          std::__cxx11::string::~string((string *)local_208);
                        }
                        else {
                          pcVar1 = this->Makefile;
                          pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                                             (&args.current);
                          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
                          local_1a1 = cmMakefile::IsDefinitionSet(pcVar1,psVar10);
                        }
                      }
                      cmArgumentList::
                      ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                                (newArgs,local_1a1,_auStack_38);
                    }
                    else {
                      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*
                                         ((_List_iterator<cmExpandedCommandArgument> *)auStack_38);
                      keyword.super_string_view._M_str = pcVar7;
                      keyword.super_string_view._M_len = sVar2;
                      bVar3 = IsKeyword(this,keyword,pcVar4);
                      if (((bVar3) && (this->Policy64Status != OLD)) &&
                         (this->Policy64Status != WARN)) {
                        pcVar1 = this->Makefile;
                        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->
                                           (&args.current);
                        psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
                        pcVar11 = cmMakefile::GetTest(pcVar1,psVar10);
                        cmArgumentList::
                        ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                                  (newArgs,pcVar11 != (cmTest *)0x0,_auStack_38);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    cmArgumentList::CurrentAndNextIter::advance
              ((CurrentAndNextIter *)auStack_38,
               &newArgs->
                super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
  }
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList& newArgs, std::string&,
                                        MessageType&)
{
  for (auto args = newArgs.make2ArgsIterator(); args.current != newArgs.end();
       args.advance(newArgs)) {

    auto policyCheck = [&, this](const cmPolicies::PolicyID id,
                                 const cmPolicies::PolicyStatus status,
                                 const cm::static_string_view kw) {
      if (status == cmPolicies::WARN && this->IsKeyword(kw, *args.current)) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(id) << "\n"
          << kw
          << " will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    };

    // NOTE Checking policies for warnings are not require an access to the
    // next arg. Check them first!
    policyCheck(cmPolicies::CMP0064, this->Policy64Status, keyTEST);

    // NOTE Fail fast: All the predicates below require the next arg to be
    // valid
    if (args.next == newArgs.end()) {
      continue;
    }

    // does a file exist
    if (this->IsKeyword(keyEXISTS, *args.current)) {
      newArgs.ReduceOneArg(cmSystemTools::FileExists(args.next->GetValue()),
                           args);
    }
    // does a directory with this name exist
    else if (this->IsKeyword(keyIS_DIRECTORY, *args.current)) {
      newArgs.ReduceOneArg(
        cmSystemTools::FileIsDirectory(args.next->GetValue()), args);
    }
    // does a symlink with this name exist
    else if (this->IsKeyword(keyIS_SYMLINK, *args.current)) {
      newArgs.ReduceOneArg(cmSystemTools::FileIsSymlink(args.next->GetValue()),
                           args);
    }
    // is the given path an absolute path ?
    else if (this->IsKeyword(keyIS_ABSOLUTE, *args.current)) {
      newArgs.ReduceOneArg(
        cmSystemTools::FileIsFullPath(args.next->GetValue()), args);
    }
    // does a command exist
    else if (this->IsKeyword(keyCOMMAND, *args.current)) {
      newArgs.ReduceOneArg(
        static_cast<bool>(
          this->Makefile.GetState()->GetCommand(args.next->GetValue())),
        args);
    }
    // does a policy exist
    else if (this->IsKeyword(keyPOLICY, *args.current)) {
      cmPolicies::PolicyID pid;
      newArgs.ReduceOneArg(
        cmPolicies::GetPolicyID(args.next->GetValue().c_str(), pid), args);
    }
    // does a target exist
    else if (this->IsKeyword(keyTARGET, *args.current)) {
      newArgs.ReduceOneArg(static_cast<bool>(this->Makefile.FindTargetToUse(
                             args.next->GetValue())),
                           args);
    }
    // is a variable defined
    else if (this->IsKeyword(keyDEFINED, *args.current)) {
      const auto& var = args.next->GetValue();
      const auto varNameLen = var.size();

      auto result = false;
      if (looksLikeSpecialVariable(var, "ENV"_s, varNameLen)) {
        const auto env = args.next->GetValue().substr(4, varNameLen - 5);
        result = cmSystemTools::HasEnv(env);
      }

      else if (looksLikeSpecialVariable(var, "CACHE"_s, varNameLen)) {
        const auto cache = args.next->GetValue().substr(6, varNameLen - 7);
        result = static_cast<bool>(
          this->Makefile.GetState()->GetCacheEntryValue(cache));
      }

      else {
        result = this->Makefile.IsDefinitionSet(args.next->GetValue());
      }
      newArgs.ReduceOneArg(result, args);
    }
    // does a test exist
    else if (this->IsKeyword(keyTEST, *args.current)) {
      if (this->Policy64Status == cmPolicies::OLD ||
          this->Policy64Status == cmPolicies::WARN) {
        continue;
      }
      newArgs.ReduceOneArg(
        static_cast<bool>(this->Makefile.GetTest(args.next->GetValue())),
        args);
    }
  }
  return true;
}